

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionBody *
Js::FunctionBody::NewFromRecycler
          (ScriptContext *scriptContext,char16 *displayName,uint displayNameLength,
          uint displayShortNameOffset,uint nestedCount,Utf8SourceInfo *sourceInfo,
          uint uFunctionNumber,uint uScriptId,LocalFunctionId functionId,Attributes attributes,
          FunctionBodyFlags flags)

{
  Recycler *pRVar1;
  FunctionBody *this;
  TrackAllocData local_68;
  Utf8SourceInfo *local_40;
  Utf8SourceInfo *sourceInfo_local;
  uint local_30;
  uint nestedCount_local;
  uint displayShortNameOffset_local;
  uint displayNameLength_local;
  char16 *displayName_local;
  ScriptContext *scriptContext_local;
  
  local_40 = sourceInfo;
  sourceInfo_local._4_4_ = nestedCount;
  local_30 = displayShortNameOffset;
  nestedCount_local = displayNameLength;
  _displayShortNameOffset_local = displayName;
  displayName_local = (char16 *)scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1ee);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_68);
  this = (FunctionBody *)new<Memory::Recycler>(0x1e8,pRVar1,0xa35d90);
  FunctionBody(this,(ScriptContext *)displayName_local,_displayShortNameOffset_local,
               nestedCount_local,local_30,sourceInfo_local._4_4_,local_40,uFunctionNumber,uScriptId,
               functionId,attributes,flags);
  return this;
}

Assistant:

FunctionBody * FunctionBody::NewFromRecycler(ScriptContext * scriptContext, const char16 * displayName, uint displayNameLength, uint displayShortNameOffset, uint nestedCount,
        Utf8SourceInfo* sourceInfo, uint uFunctionNumber, uint uScriptId, Js::LocalFunctionId  functionId, FunctionInfo::Attributes attributes, FunctionBodyFlags flags
#ifdef PERF_COUNTERS
            , bool isDeserializedFunction
#endif
            )
    {
#ifdef PERF_COUNTERS
            return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(), FunctionBody, scriptContext, displayName, displayNameLength, displayShortNameOffset, nestedCount, sourceInfo, uFunctionNumber, uScriptId, functionId, attributes, flags, isDeserializedFunction);
#else
            return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(), FunctionBody, scriptContext, displayName, displayNameLength, displayShortNameOffset, nestedCount, sourceInfo, uFunctionNumber, uScriptId, functionId, attributes, flags);
#endif
    }